

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  pointer pbVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  initializer_list<cv::Mat> __l;
  allocator_type local_3b9;
  json j;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  filenames;
  string local_390 [32];
  string local_370 [32];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_350;
  Mat img0;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> flow;
  SE3f local_1e8 [3];
  Mat local_188 [96];
  char dataset1 [68];
  Mat img1;
  char dataset0 [68];
  
  lVar5 = 0x44;
  pcVar7 = "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png";
  pcVar8 = dataset0;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pcVar8 = *pcVar7;
    pcVar7 = pcVar7 + 1;
    pcVar8 = pcVar8 + 1;
  }
  pcVar7 = "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam1/data/*.png";
  pcVar8 = dataset1;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pcVar8 = *pcVar7;
    pcVar7 = pcVar7 + 1;
    pcVar8 = pcVar8 + 1;
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&filenames,2,(allocator_type *)&flow);
  std::__cxx11::string::string<std::allocator<char>>(local_370,dataset0,(allocator<char> *)&flow);
  cv::glob(local_370,
           filenames.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,0);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::string<std::allocator<char>>(local_390,dataset1,(allocator<char> *)&flow);
  cv::glob(local_390,
           filenames.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1,0);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flow,"../data/euroc_ds_calib.json",(allocator<char> *)local_1e8);
  fromFile((string *)&j);
  std::__cxx11::string::~string((string *)&flow);
  T_1_0(local_1e8,&j);
  Sophus::SE3Base<Sophus::SE3<float,_0>_>::matrix
            ((Transformation *)&flow,(SE3Base<Sophus::SE3<float,_0>_> *)local_1e8);
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)&flow);
  std::endl<char,std::char_traits<char>>(poVar3);
  T_1_0((SE3f *)&img0,&j);
  Sophus::SE3Base<Sophus::SE3<float,_0>_>::inverse
            (local_1e8,(SE3Base<Sophus::SE3<float,_0>_> *)&img0);
  vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::OpticalFlowFrameToFrame(&flow,'\x02',local_1e8)
  ;
  for (uVar6 = 0;
      pbVar1 = ((filenames.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)((filenames.
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar6 = uVar6 + 1) {
    iVar2 = (int)(uVar6 << 5);
    cv::imread((string *)&img0,(int)pbVar1 + iVar2);
    cv::imread((string *)&img1,
               iVar2 + (int)filenames.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    cv::Mat::Mat((Mat *)local_1e8,&img0);
    cv::Mat::Mat(local_188,&img1);
    __l._M_len = 2;
    __l._M_array = (iterator)local_1e8;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_350,__l,&local_3b9);
    vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::processFrame(&flow,&local_350);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_350);
    lVar5 = 0x60;
    do {
      cv::Mat::~Mat((Mat *)((long)&local_1e8[0].so3_.unit_quaternion_.m_coeffs.
                                   super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data + lVar5));
      lVar5 = lVar5 + -0x60;
    } while (lVar5 != -0x60);
    cv::waitKey(1);
    cv::Mat::~Mat(&img1);
    cv::Mat::~Mat(&img0);
  }
  vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::~OpticalFlowFrameToFrame(&flow);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&j);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&filenames);
  return 0;
}

Assistant:

int main() {
  constexpr char dataset0[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam0/data/*.png";
  constexpr char dataset1[] =
      "/home/powei/Documents/dataset/EuRoC/V1_01_easy/mav0/cam1/data/*.png";
  // constexpr char dataset[] = "/Users/powei/Documents/mav0/cam0/data/*.png";
  vector<vector<string>> filenames(2);
  glob(dataset0, filenames[0]);
  glob(dataset1, filenames[1]);
  const nlohmann::json j = fromFile("../data/euroc_ds_calib.json");
  cout << T_1_0(j).matrix() << endl;

  vo::OpticalFlowFrameToFrame<float, vo::Pattern51> flow(2, T_1_0(j).inverse());

  for (size_t i = 0; i < filenames[0].size(); i++) {
    Mat img0 = imread(filenames[0][i], cv::IMREAD_UNCHANGED);
    Mat img1 = imread(filenames[1][i], cv::IMREAD_UNCHANGED);
    flow.processFrame({img0, img1});
    waitKey(1);
    // if(i>1000)
    //   break;
  }
  return 0;
}